

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo *pSVar1;
  bool bVar2;
  ostream *poVar3;
  TagAlias *pTVar4;
  domain_error *pdVar5;
  char *pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar7;
  byte local_652;
  allocator local_629 [33];
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  Option<Catch::TagAlias> local_5c0;
  ostringstream local_570 [8];
  ostringstream oss_1;
  SourceLineInfo local_3e8;
  allocator local_3b9;
  string local_3b8 [32];
  TagAlias local_398;
  pair<const_char_*,_Catch::TagAlias> local_350;
  value_type local_300;
  undefined1 local_292;
  allocator local_291 [33];
  string local_270 [32];
  ostringstream local_250 [8];
  ostringstream oss;
  allocator local_d1;
  string local_d0 [37];
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  char *tag_local;
  char *alias_local;
  TagAliasRegistry *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (char *)this;
  std::allocator<char>::allocator();
  local_aa = 0;
  local_ab = 0;
  std::__cxx11::string::string(local_48,alias,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"[@",&local_81);
  bVar2 = startsWith((string *)local_48,(string *)local_80);
  pcVar6 = tag_local;
  local_652 = 1;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string(local_a8,pcVar6,&local_a9);
    local_ab = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"]",&local_d1);
    bVar2 = endsWith((string *)local_a8,(string *)local_d0);
    local_652 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar6 = tag_local;
  pSVar1 = lineInfo_local;
  if ((local_652 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,(char *)pSVar1,&local_3b9);
    SourceLineInfo::SourceLineInfo(&local_3e8,local_28);
    TagAlias::TagAlias(&local_398,(string *)local_3b8,&local_3e8);
    std::make_pair<char_const*,Catch::TagAlias>(&local_350,pcVar6,&local_398);
    std::pair<std::__cxx11::string_const,Catch::TagAlias>::pair<char_const*,Catch::TagAlias>
              ((pair<std::__cxx11::string_const,Catch::TagAlias> *)&local_300,&local_350);
    pVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
            ::insert(&this->m_registry,&local_300);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
    ::~pair(&local_300);
    std::pair<const_char_*,_Catch::TagAlias>::~pair(&local_350);
    TagAlias::~TagAlias(&local_398);
    SourceLineInfo::~SourceLineInfo(&local_3e8);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    if (((pVar7.second ^ 1U) & 1) == 0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_570);
    poVar3 = std::operator<<((ostream *)local_570,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,tag_local);
    poVar3 = std::operator<<(poVar3,"\" already registered.\n");
    poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
    pcVar6 = tag_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,pcVar6,&local_5e1);
    (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_5c0,this,local_5e0);
    pTVar4 = Option<Catch::TagAlias>::operator->(&local_5c0);
    poVar3 = Catch::operator<<(poVar3,&pTVar4->lineInfo);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tRedefined at ");
    Catch::operator<<(poVar3,local_28);
    Option<Catch::TagAlias>::~Option(&local_5c0);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    pdVar5 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_608,pcVar6,local_629);
    std::domain_error::domain_error(pdVar5,local_608);
    __cxa_throw(pdVar5,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_250);
  poVar3 = std::operator<<((ostream *)local_250,"error: tag alias, \"");
  poVar3 = std::operator<<(poVar3,tag_local);
  poVar3 = std::operator<<(poVar3,"\" is not of the form [@alias name].\n");
  Catch::operator<<(poVar3,local_28);
  local_292 = 1;
  pdVar5 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,pcVar6,local_291);
  std::domain_error::domain_error(pdVar5,local_270);
  local_292 = 0;
  __cxa_throw(pdVar5,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }